

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_creation.cpp
# Opt level: O0

void construction_algorithm_parameters(void)

{
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  tree_3;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  tree_2;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  tree_1;
  max_leaf_depth_t max_leaf_depth;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  tree;
  max_leaf_size_t max_leaf_size;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  *in_stack_fffffffffffffd30;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  *this;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  *tree_00;
  max_leaf_size_t local_2b8;
  splitter_rule_t<pico_tree::median_max_side_t> *in_stack_fffffffffffffd50;
  splitter_start_bounds_t<pico_tree::bounds_from_space_t> *in_stack_fffffffffffffd58;
  splitter_stop_condition_t<pico_tree::max_leaf_size_t> *in_stack_fffffffffffffd60;
  space_type *in_stack_fffffffffffffd68;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  *in_stack_fffffffffffffd70;
  array<float,_3UL> local_218;
  array<float,_3UL> local_20c;
  bounds_t<std::array<float,_3UL>_> local_200;
  max_leaf_size_t local_1e8 [38];
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  local_b8;
  
  tree_00 = (kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
             *)&stack0xfffffffffffffff8;
  pico_tree::max_leaf_size_t::max_leaf_size_t((max_leaf_size_t *)tree_00,1);
  make_point_set();
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58,
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)in_stack_fffffffffffffd50);
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
            (&tree_00->space_);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (tree_00);
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(in_stack_fffffffffffffd30);
  this = &local_b8;
  pico_tree::max_leaf_depth_t::max_leaf_depth_t((max_leaf_depth_t *)this,0);
  make_point_set();
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_depth_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (splitter_stop_condition_t<pico_tree::max_leaf_depth_t> *)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58,
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)in_stack_fffffffffffffd50);
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
            (&tree_00->space_);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (tree_00);
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(this);
  make_point_set();
  pico_tree::max_leaf_size_t::max_leaf_size_t(local_1e8,1);
  local_20c._M_elems[0] = 0.0;
  local_20c._M_elems[1] = 0.0;
  local_20c._M_elems[2] = 0.0;
  local_218._M_elems[0] = 9.0;
  local_218._M_elems[1] = 9.0;
  local_218._M_elems[2] = 9.0;
  pico_tree::bounds_t<std::array<float,_3UL>_>::bounds_t(&local_200,&local_20c,&local_218);
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_t<std::array<float,3ul>>,pico_tree::sliding_midpoint_max_side_t>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
             (splitter_start_bounds_t<pico_tree::bounds_t<std::array<float,_3UL>_>_> *)
             in_stack_fffffffffffffd58,
             (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)in_stack_fffffffffffffd50);
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
            (&tree_00->space_);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (tree_00);
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(this);
  make_point_set();
  pico_tree::max_leaf_size_t::max_leaf_size_t(&local_2b8,1);
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::median_max_side_t>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
            (&tree_00->space_);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (tree_00);
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(this);
  return;
}

Assistant:

void construction_algorithm_parameters() {
  {
    // Every point is a leaf in the resulting kd_tree.
    pico_tree::max_leaf_size_t max_leaf_size = 1;
    pico_tree::kd_tree tree(make_point_set(), max_leaf_size);
    query_tree(tree);
  }

  {
    // The resulting kd_tree has a depth of 0. I.e., the tree is a single leaf.
    pico_tree::max_leaf_depth_t max_leaf_depth = 0;
    pico_tree::kd_tree tree(make_point_set(), max_leaf_depth);
    query_tree(tree);
  }

  {
    // Setting a custom input bounds for the point cloud. The default argument
    // equals pico_tree::bounds_from_space. This determines the bounding box
    // from the input dataset. Setting a custom bounding box can make building
    // the tree a bit more efficient if the bounds for the input point set is
    // already known.
    pico_tree::kd_tree tree(
        make_point_set(),
        pico_tree::max_leaf_size_t(1),
        pico_tree::bounds_t(
            std::array{0.0f, 0.0f, 0.0f}, std::array{9.0f, 9.0f, 9.0f}));
    query_tree(tree);
  }

  {
    // Setting the split rule as the 4th argument. It can be one of:
    // * pico_tree::median_max_side
    // * pico_tree::midpoint_max_side
    // * pico_tree::sliding_midpoint_max_side
    // The default argument is pico_tree::sliding_midpoint_max_side.
    pico_tree::kd_tree tree(
        make_point_set(),
        pico_tree::max_leaf_size_t(1),
        pico_tree::bounds_from_space,
        pico_tree::median_max_side);
    query_tree(tree);
  }
}